

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_sha1_readable(char *display,uchar *sha)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  lVar2 = 0;
  iVar1 = 0;
  iVar4 = 0;
  uVar3 = 0;
  do {
    if (iVar1 < 6) {
      if (iVar4 == 0x14) {
        __assert_fail("i != 20",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x193f,"void stb_sha1_readable(char *, unsigned char *)");
      }
      lVar5 = (long)iVar4;
      iVar4 = iVar4 + 1;
      uVar3 = uVar3 + ((uint)sha[lVar5] << ((byte)iVar1 & 0x1f));
      iVar1 = iVar1 + 8;
    }
    display[lVar2] =
         "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ%$"[uVar3 & 0x3f];
    lVar2 = lVar2 + 1;
    uVar3 = (int)uVar3 >> 6;
    iVar1 = iVar1 + -6;
  } while (lVar2 != 0x1a);
  if (iVar1 == 4) {
    display[0x1a] = "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ%$"[(int)uVar3];
    return;
  }
  __assert_fail("num_bits == 20*8 - 26*6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0x1948,"void stb_sha1_readable(char *, unsigned char *)");
}

Assistant:

void stb_sha1_readable(char display[27], unsigned char sha[20])
{
   char encoding[65] = "0123456789abcdefghijklmnopqrstuv"
                       "wxyzABCDEFGHIJKLMNOPQRSTUVWXYZ%$";
   int num_bits = 0, acc=0;
   int i=0,o=0;
   while (o < 26) {
      int v;
      // expand the accumulator
      if (num_bits < 6) {
         assert(i != 20);
         acc += sha[i++] << num_bits;
         num_bits += 8;
      }
      v = acc & ((1 << 6) - 1);
      display[o++] = encoding[v];
      acc >>= 6;
      num_bits -= 6;
   }
   assert(num_bits == 20*8 - 26*6);
   display[o++] = encoding[acc];   
}